

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

TValue * luaH_get(Table *t,TValue *key)

{
  double dVar1;
  double dVar2;
  int iVar3;
  Node *pNVar4;
  TValue *unaff_R14;
  
  iVar3 = key->tt;
  if (iVar3 != 0) {
    if (iVar3 == 3) {
      dVar1 = (key->value).n;
      dVar2 = (double)(int)dVar1;
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
        unaff_R14 = luaH_getnum(t,(int)dVar1);
      }
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
        return unaff_R14;
      }
    }
    else if (iVar3 == 4) {
      pNVar4 = t->node + (int)(~(uint)(-1L << (t->lsizenode & 0x3f)) &
                              *(uint *)((long)(key->value).gc + 0xc));
      do {
        if (((pNVar4->i_key).nk.tt == 4) && ((pNVar4->i_key).nk.value.gc == (key->value).gc)) {
          return &pNVar4->i_val;
        }
        pNVar4 = *(Node **)((long)&pNVar4->i_key + 0x10);
      } while (pNVar4 != (Node *)0x0);
      goto LAB_00107677;
    }
    pNVar4 = mainposition(t,key);
    do {
      iVar3 = luaO_rawequalObj(&(pNVar4->i_key).tvk,key);
      if (iVar3 != 0) {
        return &pNVar4->i_val;
      }
      pNVar4 = *(Node **)((long)&pNVar4->i_key + 0x10);
    } while (pNVar4 != (Node *)0x0);
  }
LAB_00107677:
  return &luaO_nilobject_;
}

Assistant:

static const TValue*luaH_get(Table*t,const TValue*key){
switch(ttype(key)){
case 0:return(&luaO_nilobject_);
case 4:return luaH_getstr(t,rawtsvalue(key));
case 3:{
int k;
lua_Number n=nvalue(key);
lua_number2int(k,n);
if(luai_numeq(cast_num(k),nvalue(key)))
return luaH_getnum(t,k);
}
default:{
Node*n=mainposition(t,key);
do{
if(luaO_rawequalObj(key2tval(n),key))
return gval(n);
else n=gnext(n);
}while(n);
return(&luaO_nilobject_);
}
}
}